

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChFilePS.cpp
# Opt level: O2

void __thiscall
chrono::ChFile_ps::DrawLine
          (ChFile_ps *this,ChVector2<double> *mfrom,ChVector2<double> *mto,Space space)

{
  double local_68;
  double dStack_60;
  double local_58;
  double dStack_50;
  undefined1 local_40 [32];
  
  GrSave(this);
  StartLine(this);
  local_58 = mfrom->m_data[0];
  dStack_50 = mfrom->m_data[1];
  TransPt((ChFile_ps *)(local_40 + 0x10),(ChVector2<double> *)this,(Space)&local_58);
  MoveTo(this,(ChVector2<double> *)(local_40 + 0x10));
  local_68 = mto->m_data[0];
  dStack_60 = mto->m_data[1];
  TransPt((ChFile_ps *)local_40,(ChVector2<double> *)this,(Space)&local_68);
  AddLinePoint(this,(ChVector2<double> *)local_40);
  PaintStroke(this);
  GrRestore(this);
  return;
}

Assistant:

void ChFile_ps::DrawLine(ChVector2<> mfrom, ChVector2<> mto, Space space) {
    GrSave();
    StartLine();
    MoveTo(TransPt(mfrom, space));
    AddLinePoint(TransPt(mto, space));
    PaintStroke();
    GrRestore();
}